

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O3

void __thiscall
jaegertracing::Config::Config
          (Config *this,bool disabled,Config *sampler,Config *reporter,HeadersConfig *headers,
          RestrictionsConfig *baggageRestrictions,string *serviceName,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  rep rVar4;
  
  this->_disabled = disabled;
  (this->_serviceName)._M_dataplus._M_p = (pointer)&(this->_serviceName).field_2;
  pcVar1 = (serviceName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_serviceName,pcVar1,pcVar1 + serviceName->_M_string_length);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&this->_tags,tags);
  (this->_sampler)._type._M_dataplus._M_p = (pointer)&(this->_sampler)._type.field_2;
  pcVar1 = (sampler->_type)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_sampler,pcVar1,pcVar1 + (sampler->_type)._M_string_length);
  (this->_sampler)._param = sampler->_param;
  (this->_sampler)._samplingServerURL._M_dataplus._M_p =
       (pointer)&(this->_sampler)._samplingServerURL.field_2;
  pcVar1 = (sampler->_samplingServerURL)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_sampler)._samplingServerURL,pcVar1,
             pcVar1 + (sampler->_samplingServerURL)._M_string_length);
  uVar2 = *(undefined4 *)&sampler->field_0x4c;
  rVar4 = (sampler->_samplingRefreshInterval).__r;
  (this->_sampler)._maxOperations = sampler->_maxOperations;
  *(undefined4 *)&(this->_sampler).field_0x4c = uVar2;
  (this->_sampler)._samplingRefreshInterval.__r = rVar4;
  uVar2 = *(undefined4 *)&reporter->field_0x4;
  rVar4 = (reporter->_bufferFlushInterval).__r;
  uVar3 = *(undefined4 *)((long)&(reporter->_bufferFlushInterval).__r + 4);
  (this->_reporter)._queueSize = reporter->_queueSize;
  *(undefined4 *)&(this->_reporter).field_0x4 = uVar2;
  *(int *)&(this->_reporter)._bufferFlushInterval.__r = (int)rVar4;
  *(undefined4 *)((long)&(this->_reporter)._bufferFlushInterval.__r + 4) = uVar3;
  (this->_reporter)._logSpans = reporter->_logSpans;
  (this->_reporter)._localAgentHostPort._M_dataplus._M_p =
       (pointer)&(this->_reporter)._localAgentHostPort.field_2;
  pcVar1 = (reporter->_localAgentHostPort)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_reporter)._localAgentHostPort,pcVar1,
             pcVar1 + (reporter->_localAgentHostPort)._M_string_length);
  (this->_reporter)._endpoint._M_dataplus._M_p = (pointer)&(this->_reporter)._endpoint.field_2;
  pcVar1 = (reporter->_endpoint)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_reporter)._endpoint,pcVar1,
             pcVar1 + (reporter->_endpoint)._M_string_length);
  propagation::HeadersConfig::HeadersConfig(&this->_headers,headers);
  (this->_baggageRestrictions)._denyBaggageOnInitializationFailure =
       baggageRestrictions->_denyBaggageOnInitializationFailure;
  (this->_baggageRestrictions)._hostPort._M_dataplus._M_p =
       (pointer)&(this->_baggageRestrictions)._hostPort.field_2;
  pcVar1 = (baggageRestrictions->_hostPort)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_baggageRestrictions)._hostPort,pcVar1,
             pcVar1 + (baggageRestrictions->_hostPort)._M_string_length);
  (this->_baggageRestrictions)._refreshInterval.__r = (baggageRestrictions->_refreshInterval).__r;
  return;
}

Assistant:

explicit Config(bool disabled = false,
                    const samplers::Config& sampler = samplers::Config(),
                    const reporters::Config& reporter = reporters::Config(),
                    const propagation::HeadersConfig& headers =
                        propagation::HeadersConfig(),
                    const baggage::RestrictionsConfig& baggageRestrictions =
                        baggage::RestrictionsConfig(),
                    const std::string& serviceName = "",
                    const std::vector<Tag>&  tags = std::vector<Tag>())
        : _disabled(disabled)
        , _serviceName(serviceName)
        , _tags(tags)
        , _sampler(sampler)
        , _reporter(reporter)
        , _headers(headers)
        , _baggageRestrictions(baggageRestrictions)
    {
    }